

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::MergedDescriptorDatabase::FindFileContainingSymbol
          (MergedDescriptorDatabase *this,StringViewArg symbol_name,FileDescriptorProto *output)

{
  pointer ppDVar1;
  DescriptorDatabase *pDVar2;
  int iVar3;
  byte unaff_BPL;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  FileDescriptorProto temp;
  FileDescriptorProto local_128;
  
  ppDVar1 = (this->sources_).
            super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar6 = (this->sources_).
          super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppDVar1;
  if (bVar6) {
    iVar3 = (*(*ppDVar1)->_vptr_DescriptorDatabase[3])();
    if ((char)iVar3 == '\0') {
      uVar5 = 1;
      do {
        uVar4 = uVar5;
        ppDVar1 = (this->sources_).
                  super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar6 = uVar4 < (ulong)((long)(this->sources_).
                                      super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1 >>
                               3);
        if (!bVar6) goto LAB_001b4a9f;
        pDVar2 = ppDVar1[uVar4];
        iVar3 = (*pDVar2->_vptr_DescriptorDatabase[3])(pDVar2,symbol_name,output);
        uVar5 = uVar4 + 1;
      } while ((char)iVar3 == '\0');
    }
    else {
      uVar4 = 0;
    }
    FileDescriptorProto::FileDescriptorProto(&local_128,(Arena *)0x0);
    unaff_BPL = uVar4 == 0;
    if (!(bool)unaff_BPL) {
      uVar5 = 1;
      do {
        pDVar2 = (this->sources_).
                 super__Vector_base<google::protobuf::DescriptorDatabase_*,_std::allocator<google::protobuf::DescriptorDatabase_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar5 - 1];
        iVar3 = (*pDVar2->_vptr_DescriptorDatabase[2])
                          (pDVar2,(ulong)(output->field_0)._impl_.name_.tagged_ptr_.ptr_ &
                                  0xfffffffffffffffc,&local_128);
        if ((char)iVar3 != '\0') break;
        unaff_BPL = uVar4 <= uVar5;
        bVar7 = uVar5 != uVar4;
        uVar5 = uVar5 + 1;
      } while (bVar7);
    }
    FileDescriptorProto::~FileDescriptorProto(&local_128);
  }
LAB_001b4a9f:
  return (bool)(bVar6 & unaff_BPL);
}

Assistant:

EncodedDescriptorDatabase::~EncodedDescriptorDatabase() {
  for (void* p : files_to_delete_) {
    operator delete(p);
  }
}